

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

utf8_size_t utf8_trimmed_length(utf8_char_t *data,utf8_size_t charcters)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  utf8_size_t uVar4;
  byte bVar5;
  bool bVar6;
  
  bVar5 = *data;
  if (charcters == 0 || bVar5 == 0) {
    return 0;
  }
  uVar4 = 0;
  lVar3 = 0;
  uVar2 = 1;
  while( true ) {
    lVar1 = *(long *)((long)utf8_char_length::_utf8_char_length + (ulong)(bVar5 & 0xf8));
    if (((0x20 < bVar5) && (bVar5 != 0x7f)) && ((bVar5 != 0xc2 || (data[1] != -0x60)))) {
      uVar4 = lVar3 + lVar1;
    }
    lVar3 = lVar3 + lVar1;
    bVar5 = data[lVar1];
    if (bVar5 == 0) break;
    data = data + lVar1;
    bVar6 = charcters <= uVar2;
    uVar2 = uVar2 + 1;
    if (bVar6) {
      return uVar4;
    }
  }
  return uVar4;
}

Assistant:

size_t utf8_trimmed_length(const utf8_char_t* data, utf8_size_t charcters)
{
    size_t l, t = 0, split_at = 0;
    for (size_t c = 0; (*data) && c < charcters; ++c) {
        l = utf8_char_length(data);
        if (!utf8_char_whitespace(data)) {
            split_at = t + l;
        }
         t += l, data += l;
    }

    return split_at;
}